

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdAuto.c
# Opt level: O2

Vec_Wec_t * Cmd_ReadParamChoices(char *pConfig)

{
  byte bVar1;
  double dVar2;
  char cVar3;
  FILE *pFVar4;
  Vec_Wec_t *pVVar5;
  char *pcVar6;
  size_t sVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  byte *pbVar11;
  uint local_434;
  Vec_Int_t *local_428;
  undefined8 local_420;
  char pBuffer [1000];
  
  pFVar4 = fopen(pConfig,"rb");
  if (pFVar4 == (FILE *)0x0) {
    pcVar6 = "File containing list of files \"%s\" cannot be opened.\n";
LAB_002d09ab:
    pVVar5 = (Vec_Wec_t *)0x0;
    printf(pcVar6,pConfig);
  }
  else {
    pVVar5 = (Vec_Wec_t *)malloc(0x10);
    pVVar5->nCap = 100;
    pVVar5->nSize = 0;
    local_420 = pFVar4;
    local_428 = (Vec_Int_t *)calloc(100,0x10);
    pVVar5->pArray = local_428;
    local_434 = 100;
    pFVar4 = local_420;
    uVar10 = 0;
    while (pcVar6 = fgets(pBuffer,1000,pFVar4), pcVar6 != (char *)0x0) {
      if ((0x23 < (ulong)(byte)pBuffer[0]) ||
         ((0x900002600U >> ((ulong)(byte)pBuffer[0] & 0x3f) & 1) == 0)) {
        while( true ) {
          sVar7 = strlen(pBuffer);
          uVar8 = (ulong)(byte)pBuffer[sVar7 - 1];
          if ((0x20 < uVar8) || ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0)) break;
          pBuffer[sVar7 - 1] = '\0';
        }
        if (uVar10 == local_434) {
          uVar9 = local_434 * 2;
          if ((int)local_434 < 0x10) {
            uVar9 = 0x10;
          }
          if (uVar9 - local_434 != 0 && (int)local_434 <= (int)uVar9) {
            if (local_428 == (Vec_Int_t *)0x0) {
              local_428 = (Vec_Int_t *)malloc((ulong)uVar9 << 4);
            }
            else {
              local_428 = (Vec_Int_t *)realloc(local_428,(ulong)uVar9 << 4);
            }
            pVVar5->pArray = local_428;
            memset(local_428 + (int)local_434,0,(long)(int)(uVar9 - local_434) << 4);
            pVVar5->nCap = uVar9;
            local_434 = uVar9;
          }
        }
        uVar9 = uVar10 + 1;
        pVVar5->nSize = uVar9;
        if ((int)uVar10 < 0) {
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                        ,0xa1,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
        }
        uVar8 = (ulong)(byte)pBuffer[0];
        pbVar11 = (byte *)pBuffer;
LAB_002d08c9:
        cVar3 = (char)uVar8;
        pFVar4 = local_420;
        uVar10 = uVar9;
        if (cVar3 != '\0') {
          if ((byte)(cVar3 + 0x85U) < 0xe6) {
            if ((byte)(cVar3 + 0xa5U) < 0xe6) {
              pcVar6 = "Expecting a leading lower-case or upper-case digit in line \"%s\".\n";
              pConfig = pBuffer;
              goto LAB_002d09ab;
            }
            if (pbVar11[1] != 0x2e && (byte)(pbVar11[1] - 0x3a) < 0xf6) {
              printf("Upper-case character (%c) should be followed by a number without space in line \"%s\".\n"
                     ,uVar8,pBuffer);
              return (Vec_Wec_t *)0x0;
            }
            dVar2 = atof((char *)(pbVar11 + 1));
            Vec_IntPushTwo(local_428 + ((ulong)uVar9 - 1),(int)uVar8,(int)(float)dVar2);
            do {
              bVar1 = pbVar11[1];
              pbVar11 = pbVar11 + 1;
            } while (bVar1 == 0x2e || 0xf5 < (byte)(bVar1 - 0x3a));
            while ((uVar8 = (ulong)bVar1, bVar1 < 0x21 &&
                   ((0x100002600U >> (uVar8 & 0x3f) & 1) != 0))) {
              bVar1 = pbVar11[1];
              pbVar11 = pbVar11 + 1;
            }
          }
          else {
            Vec_IntPushTwo(local_428 + ((ulong)uVar9 - 1),(int)uVar8,-0x40800000);
            do {
              pbVar11 = pbVar11 + 1;
              uVar8 = (ulong)*pbVar11;
              if (0x20 < uVar8) break;
            } while ((0x100002600U >> (uVar8 & 0x3f) & 1) != 0);
          }
          goto LAB_002d08c9;
        }
      }
    }
    fclose(pFVar4);
  }
  return pVVar5;
}

Assistant:

Vec_Wec_t * Cmd_ReadParamChoices( char * pConfig )
{
    Vec_Wec_t * vPars;
    Vec_Int_t * vLine;
    char * pThis, pBuffer[CMD_AUTO_LINE_MAX];
    FILE * pFile = fopen( pConfig, "rb" );
    if ( pFile == NULL )
        { printf( "File containing list of files \"%s\" cannot be opened.\n", pConfig ); return NULL; }
    vPars = Vec_WecAlloc( 100 );
    while ( fgets( pBuffer, CMD_AUTO_LINE_MAX, pFile ) != NULL )
    {
        // get the command from the file
        if ( Cmf_IsSpace(pBuffer[0]) || pBuffer[0] == '#')
            continue;
        // skip trailing spaces
        while ( Cmf_IsSpace(pBuffer[strlen(pBuffer)-1]) )
            pBuffer[strlen(pBuffer)-1] = 0;
        // read the line
        vLine = Vec_WecPushLevel( vPars );
        for ( pThis = pBuffer; *pThis;  )
        {
            if ( Cmf_IsLowerCaseChar(*pThis) )
            {
                Vec_IntPushTwo( vLine, (int)*pThis, Abc_Float2Int((float)-1.0) );
                pThis++;
                while ( Cmf_IsSpace(*pThis) )
                    pThis++;
                continue;
            }
            if ( Cmf_IsUpperCaseChar(*pThis) )
            {
                char Param = *pThis++;
                if ( !Cmf_IsDigit(*pThis) )
                    { printf( "Upper-case character (%c) should be followed by a number without space in line \"%s\".\n", Param, pBuffer ); return NULL; }
                Vec_IntPushTwo( vLine, (int)Param, Abc_Float2Int(atof(pThis)) );
                while ( Cmf_IsDigit(*pThis) )
                    pThis++;
                while ( Cmf_IsSpace(*pThis) )
                    pThis++;
                continue;
            }
            printf( "Expecting a leading lower-case or upper-case digit in line \"%s\".\n", pBuffer ); 
            return NULL;
        }
    }
    fclose( pFile );
    return vPars;
}